

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_flight_append(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_flight_item *__ptr;
  uchar *puVar1;
  mbedtls_ssl_flight_item *local_28;
  mbedtls_ssl_flight_item *cur;
  mbedtls_ssl_flight_item *msg;
  mbedtls_ssl_context *ssl_local;
  
  __ptr = (mbedtls_ssl_flight_item *)calloc(1,0x20);
  if (__ptr == (mbedtls_ssl_flight_item *)0x0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x9aa,"alloc %d bytes failed",0x20);
    ssl_local._4_4_ = -0x7f00;
  }
  else {
    puVar1 = (uchar *)calloc(1,ssl->out_msglen);
    __ptr->p = puVar1;
    if (puVar1 == (uchar *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x9b0,"alloc %d bytes failed",ssl->out_msglen);
      free(__ptr);
      ssl_local._4_4_ = -0x7f00;
    }
    else {
      memcpy(__ptr->p,ssl->out_msg,ssl->out_msglen);
      __ptr->len = ssl->out_msglen;
      __ptr->type = (uchar)ssl->out_msgtype;
      __ptr->next = (mbedtls_ssl_flight_item *)0x0;
      if (ssl->handshake->flight == (mbedtls_ssl_flight_item *)0x0) {
        ssl->handshake->flight = __ptr;
      }
      else {
        for (local_28 = ssl->handshake->flight; local_28->next != (mbedtls_ssl_flight_item *)0x0;
            local_28 = local_28->next) {
        }
        local_28->next = __ptr;
      }
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_flight_append( mbedtls_ssl_context *ssl )
{
    mbedtls_ssl_flight_item *msg;

    /* Allocate space for current message */
    if( ( msg = mbedtls_calloc( 1, sizeof(  mbedtls_ssl_flight_item ) ) ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc %d bytes failed",
                            sizeof( mbedtls_ssl_flight_item ) ) );
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    if( ( msg->p = mbedtls_calloc( 1, ssl->out_msglen ) ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc %d bytes failed", ssl->out_msglen ) );
        mbedtls_free( msg );
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    /* Copy current handshake message with headers */
    memcpy( msg->p, ssl->out_msg, ssl->out_msglen );
    msg->len = ssl->out_msglen;
    msg->type = ssl->out_msgtype;
    msg->next = NULL;

    /* Append to the current flight */
    if( ssl->handshake->flight == NULL )
        ssl->handshake->flight = msg;
    else
    {
        mbedtls_ssl_flight_item *cur = ssl->handshake->flight;
        while( cur->next != NULL )
            cur = cur->next;
        cur->next = msg;
    }

    return( 0 );
}